

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

char * ImStrdup(char *str)

{
  size_t sVar1;
  char *__dest;
  void *buf;
  size_t len;
  char *str_local;
  
  sVar1 = strlen(str);
  __dest = (char *)ImGui::MemAlloc(sVar1 + 1);
  memcpy(__dest,str,sVar1 + 1);
  return __dest;
}

Assistant:

char* ImStrdup(const char* str)
{
    size_t len = strlen(str);
    void* buf = IM_ALLOC(len + 1);
    return (char*)memcpy(buf, (const void*)str, len + 1);
}